

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  TPZGeoTetrahedra *in_stack_ffffffffffffffc0;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  uVar1 = Hash(str);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)0x1b8b6fd);
  pzgeom::TPZGeoTetrahedra::TPZGeoTetrahedra((TPZGeoTetrahedra *)CONCAT44(uVar1,iVar2));
  iVar3 = pzgeom::TPZGeoTetrahedra::ClassId(in_stack_ffffffffffffffc0);
  pzgeom::TPZGeoTetrahedra::~TPZGeoTetrahedra((TPZGeoTetrahedra *)0x1b8b74a);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}